

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

void __thiscall Gecko::Graph::~Graph(Graph *this)

{
  pointer pfVar1;
  pointer puVar2;
  pointer pNVar3;
  
  pfVar1 = (this->bond).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (this->weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  puVar2 = (this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  pNVar3 = (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pNVar3 != (pointer)0x0) {
    operator_delete(pNVar3);
  }
  puVar2 = (this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    return;
  }
  return;
}

Assistant:

Graph(uint nodes = 0) : level(0), last_node(Node::null) { init(nodes); }